

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.h
# Opt level: O0

S2Point * S2::Origin(void)

{
  Vector3<double> *in_RDI;
  
  Vector3<double>::Vector3(in_RDI,-0.00999946643502502,0.002592454260932412,0.999946643502502);
  return in_RDI;
}

Assistant:

inline S2Point Origin() {
#ifdef S2_TEST_DEGENERACIES
  // This value makes polygon operations much slower, because it greatly
  // increases the number of degenerate cases that need to be handled using
  // s2pred::ExpensiveSign().
  return S2Point(0, 0, 1);
#else
  // The origin should not be a point that is commonly used in edge tests in
  // order to avoid triggering code to handle degenerate cases.  (This rules
  // out the north and south poles.)  It should also not be on the boundary of
  // any low-level S2Cell for the same reason.
  //
  // The point chosen here is about 66km from the north pole towards the East
  // Siberian Sea.  See the unittest for more details.  It is written out
  // explicitly using floating-point literals because the optimizer doesn't
  // seem willing to evaluate Normalize() at compile time.
  return S2Point(-0.0099994664350250197, 0.0025924542609324121,
                 0.99994664350250195);
#endif
}